

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetOtherScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan,
              int *pNbMeasurements)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  double dVar5;
  byte bVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  uchar *puVar12;
  byte bVar13;
  byte bVar14;
  uchar *puVar15;
  uchar *puVar16;
  byte bVar17;
  double dVar18;
  double dVar19;
  uchar databuf [132];
  uchar local_b8 [2];
  byte local_b6;
  byte local_b5;
  undefined4 local_68;
  
  bVar17 = 0;
  memset(local_b8,0,0x84);
  iVar7 = pRPLIDAR->esversion;
  if (iVar7 == 0x85) {
LAB_001a8ed3:
    iVar7 = 0x54;
LAB_001a8eef:
    iVar7 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,local_b8,iVar7);
    if (iVar7 != 0) {
      return 1;
    }
    uVar9 = (local_b5 & 0x7f) << 8;
    iVar7 = pRPLIDAR->esversion;
    if (iVar7 == 0x85) {
      puVar12 = pRPLIDAR->desdata_prev;
      bVar2 = pRPLIDAR->desdata_prev[3];
      bVar3 = pRPLIDAR->desdata_prev[2];
      *pbNewScan = (uint)(bVar2 >> 7);
      *pNbMeasurements = 0x28;
      dVar19 = (double)((uint)bVar3 | (bVar2 & 0x7f) << 8) * 0.015625;
      dVar18 = (double)(local_b6 | uVar9) * 0.015625;
      lVar10 = 0;
      do {
        uVar4 = *(ushort *)(pRPLIDAR->desdata_prev + lVar10 * 2 + 4);
        dVar5 = fmod(((((double)(int)lVar10 *
                       ((double)(~-(ulong)(dVar18 < dVar19) & (ulong)dVar18 |
                                (ulong)(dVar18 + 360.0) & -(ulong)(dVar18 < dVar19)) - dVar19)) /
                       40.0 + dVar19) * -3.141592653589793) / 180.0,6.283185307179586);
        dVar5 = fmod(dVar5 + 9.42477796076938,6.283185307179586);
        pAngles[lVar10] = dVar5 + -3.141592653589793;
        pDistances[lVar10] = (double)uVar4 / 1000.0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x28);
    }
    else {
      if (iVar7 == 0x84) {
        puts(
            "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. "
            );
        return 0x11;
      }
      if (iVar7 != 0x82) goto LAB_001a91a6;
      puVar12 = pRPLIDAR->esdata_prev;
      bVar2 = pRPLIDAR->esdata_prev[3];
      bVar3 = pRPLIDAR->esdata_prev[2];
      *pbNewScan = (uint)(bVar2 >> 7);
      *pNbMeasurements = 0x20;
      dVar19 = (double)((uint)bVar3 | (bVar2 & 0x7f) << 8) * 0.015625;
      dVar18 = (double)(local_b6 | uVar9) * 0.015625;
      dVar18 = (double)(~-(ulong)(dVar18 < dVar19) & (ulong)dVar18 |
                       (ulong)(dVar18 + 360.0) & -(ulong)(dVar18 < dVar19)) - dVar19;
      puVar16 = pRPLIDAR->esdata_prev + 8;
      lVar10 = 0;
      do {
        uVar4 = *(ushort *)(puVar16 + -4);
        bVar2 = puVar16[-1];
        bVar3 = puVar16[-6];
        bVar6 = (puVar16[-4] & 3) << 4;
        bVar13 = *puVar16 & 0xf;
        bVar11 = puVar16[-2] << 4;
        bVar8 = *puVar16 >> 4;
        bVar14 = (bVar13 | bVar6 & 0x1f) + 1;
        if (bVar6 < 0x20) {
          bVar14 = bVar13 | bVar6;
        }
        bVar6 = (bVar8 | bVar11 & 0x1f) + 1;
        if ((bVar11 & 0x30) < 0x20) {
          bVar6 = bVar8 | bVar11 & 0x3f;
        }
        lVar1 = lVar10 + 2;
        dVar5 = fmod(((((double)((int)lVar10 + 1) * dVar18 * 0.03125 + dVar19) -
                      (double)bVar14 * 0.125) * -3.141592653589793) / 180.0,6.283185307179586);
        dVar5 = fmod(dVar5 + 9.42477796076938,6.283185307179586);
        pAngles[lVar10] = dVar5 + -3.141592653589793;
        dVar5 = fmod(((((double)(int)lVar1 * dVar18 * 0.03125 + dVar19) - (double)bVar6 * 0.125) *
                     -3.141592653589793) / 180.0,6.283185307179586);
        dVar5 = fmod(dVar5 + 9.42477796076938,6.283185307179586);
        pAngles[lVar10 + 1] = dVar5 + -3.141592653589793;
        pDistances[lVar10] = (double)(uVar4 >> 2) / 1000.0;
        pDistances[lVar10 + 1] = (double)(ushort)(CONCAT11(bVar2,bVar3) >> 2) / 1000.0;
        puVar16 = puVar16 + 5;
        lVar10 = lVar1;
      } while (lVar1 != 0x20);
    }
    puVar16 = local_b8;
    puVar15 = puVar12;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)puVar15 = *(undefined8 *)puVar16;
      puVar16 = puVar16 + ((ulong)bVar17 * -2 + 1) * 8;
      puVar15 = puVar15 + (ulong)bVar17 * -0x10 + 8;
    }
    *(undefined4 *)(puVar12 + 0x50) = local_68;
    iVar7 = 0;
  }
  else {
    if (iVar7 == 0x84) {
      iVar7 = 0x84;
      goto LAB_001a8eef;
    }
    if (iVar7 == 0x82) goto LAB_001a8ed3;
LAB_001a91a6:
    puts("A RPLIDAR is not responding correctly : Unhandled response descriptor. ");
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

inline int GetOtherScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan, int* pNbMeasurements)
{
	int j = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	CHRONO chrono;

	*pNbMeasurements = NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR;

	StartChrono(&chrono);

	while ((int)nodesRead < *pNbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = *pNbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}

	*pNbMeasurements = (int)nodesRead;

	// Analyze the data response.
	*pbNewScan = 0;

	//memset(pAngles, 0, nodesRead*sizeof(double));
	//memset(pDistances, 0, nodesRead*sizeof(double));
	for (j = 0; j < (int)nodesRead; j++)
	{
		*pbNewScan = (*pbNewScan) | (nodes[j].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);

		// Convert in rad.
		pAngles[j] = fmod_2PI_deg2rad(-nodes[j].angle_z_q14*90.0/(1 << 14));

		// Convert in m.
		pDistances[j] = nodes[j].dist_mm_q2/4000.0;
	}
#else
	unsigned char databuf[max(max(NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR), NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)];
	unsigned short start_angle_q6 = 0;
	unsigned short start_angle_q6_prev = 0;

	unsigned short distance1 = 0; // Legacy.
	unsigned short distance2 = 0; // Legacy.
	char dtheta1_q3 = 0; // Legacy.
	char dtheta2_q3 = 0; // Legacy.
	double dtheta1 = 0; // Legacy.
	double dtheta2 = 0; // Legacy.
	double theta1 = 0; // Legacy.
	double theta2 = 0; // Legacy.

	//unsigned int major = 0, predict1 = 0, predict2 = 0; // Extended.

	unsigned short distance = 0; // Dense.
	double theta = 0; // Dense.

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}

	start_angle_q6 = ((databuf[3] & 0x7F)<<8) | databuf[2];

	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		// Analyze the previous data response.
		start_angle_q6_prev = ((pRPLIDAR->esdata_prev[3] & 0x7F)<<8) | pRPLIDAR->esdata_prev[2];
		*pbNewScan = pRPLIDAR->esdata_prev[3]>>7;

		*pNbMeasurements = NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//memset(pAngles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//memset(pDistances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		for (j = 0; j < NB_CABINS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		{
			distance1 = ((pRPLIDAR->esdata_prev[4+5*j+1]<<8)|pRPLIDAR->esdata_prev[4+5*j+0])>>2;
			distance2 = ((pRPLIDAR->esdata_prev[4+5*j+3]<<8)|pRPLIDAR->esdata_prev[5*j+2])>>2;
			dtheta1_q3 = ((pRPLIDAR->esdata_prev[4+5*j+0] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4] & 0x0F);
			dtheta2_q3 = ((pRPLIDAR->esdata_prev[4+5*j+2] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4]>>4);
			// Handle the sign bit...
			dtheta1 = ((dtheta1_q3 & 0x20)>>5)? (-~(dtheta1_q3 & 0x1F))/8.0: (dtheta1_q3 & 0x1F)/8.0;
			dtheta2 = ((dtheta2_q3 & 0x20)>>5)? (-~(dtheta2_q3 & 0x1F))/8.0: (dtheta2_q3 & 0x1F)/8.0;

			// k indexes in the formula of the documentation start at 1...
			theta1 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+1)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta1;
			theta2 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+2)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta2;

			// Convert in rad.
			pAngles[2*j+0] = fmod_2PI_deg2rad(-theta1);
			pAngles[2*j+1] = fmod_2PI_deg2rad(-theta2);

			// Convert in m.
			pDistances[2*j+0] = distance1/1000.0;
			pDistances[2*j+1] = distance2/1000.0;
		}
		memcpy(pRPLIDAR->esdata_prev, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n");
		return EXIT_NOT_IMPLEMENTED;

		// Need to check SDK code...  		 

		//// Analyze the previous data response.
		//start_angle_q6_prev = ((pRPLIDAR->eesdata_prev[3] & 0x7F)<<8) | pRPLIDAR->eesdata_prev[2];
		//*pbNewScan = pRPLIDAR->eesdata_prev[3]>>7;

		//*pNbMeasurements = NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		////memset(pAngles, 0, NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		////memset(pDistances, 0, NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//for (j = 0; j < NB_CABINS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		//{
		//	major = ((pRPLIDAR->eesdata_prev[4+4*j+1] & 0x0F)<<8)|(pRPLIDAR->eesdata_prev[4+4*j+0]);
		//	predict1 = ((pRPLIDAR->eesdata_prev[4+4*j+2] & 0x03)<<6)|((pRPLIDAR->eesdata_prev[4+4*j+1] & 0xF0)>>4);
		//	predict2 = ((pRPLIDAR->eesdata_prev[4+4*j+3] & 0xFF)<<2)|((pRPLIDAR->eesdata_prev[4+4*j+2] & 0xC0)>>6);

		//	// k indexes in the formula of the documentation start at 1...
		//	theta = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*j/NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//	// Convert in rad.
		//	pAngles[j] = fmod_2PI_deg2rad(-theta);

		//	// Convert in m.
		//	pDistances[j] = distance/1000.0;
		//}
		//memcpy(pRPLIDAR->eesdata_prev, databuf, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		// Analyze the previous data response.
		start_angle_q6_prev = ((pRPLIDAR->desdata_prev[3] & 0x7F)<<8) | pRPLIDAR->desdata_prev[2];
		*pbNewScan = pRPLIDAR->desdata_prev[3]>>7;

		*pNbMeasurements = NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//memset(pAngles, 0, NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//memset(pDistances, 0, NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		for (j = 0; j < NB_CABINS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		{
			distance = ((pRPLIDAR->desdata_prev[4+2*j+1]<<8)|pRPLIDAR->desdata_prev[4+2*j+0]);

			// k indexes in the formula of the documentation start at 1...
			theta = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*j/NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

			// Convert in rad.
			pAngles[j] = fmod_2PI_deg2rad(-theta);

			// Convert in m.
			pDistances[j] = distance/1000.0;
		}
		memcpy(pRPLIDAR->desdata_prev, databuf, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}